

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UBool uhash_compareUnicodeString_63(UElement key1,UElement key2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  UnicodeString *str2;
  void *__s2;
  UnicodeString *str1;
  void *__s1;
  int iVar4;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer != (void *)0x0 && key1.pointer != (void *)0x0) {
    uVar1 = *(ushort *)((long)key1.pointer + 8);
    if ((uVar1 & 1) != 0) {
      return *(byte *)((long)key2.pointer + 8) & 1;
    }
    if ((short)uVar1 < 0) {
      iVar3 = *(int *)((long)key1.pointer + 0xc);
    }
    else {
      iVar3 = (int)(short)uVar1 >> 5;
    }
    uVar2 = *(ushort *)((long)key2.pointer + 8);
    if ((short)uVar2 < 0) {
      iVar4 = *(int *)((long)key2.pointer + 0xc);
    }
    else {
      iVar4 = (int)(short)uVar2 >> 5;
    }
    if ((((int)(short)uVar2 & 1U) == 0) && (iVar3 == iVar4)) {
      if ((uVar1 & 2) == 0) {
        __s1 = *(void **)((long)key1.pointer + 0x18);
      }
      else {
        __s1 = key1.pointer + 10;
      }
      if ((uVar2 & 2) == 0) {
        __s2 = *(void **)((long)key2.pointer + 0x18);
      }
      else {
        __s2 = key2.pointer + 10;
      }
      iVar3 = bcmp(__s1,__s2,(long)(iVar3 * 2));
      return iVar3 == 0;
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareUnicodeString(const UElement key1, const UElement key2) {
    const UnicodeString *str1 = (const UnicodeString*) key1.pointer;
    const UnicodeString *str2 = (const UnicodeString*) key2.pointer;
    if (str1 == str2) {
        return TRUE;
    }
    if (str1 == NULL || str2 == NULL) {
        return FALSE;
    }
    return *str1 == *str2;
}